

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_2::ValidateForwardDecls(ValidationState_t *_)

{
  size_t sVar1;
  DiagnosticStream *pDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  DiagnosticStream local_410;
  string local_238 [8];
  __string_type id_str;
  reference_wrapper<spvtools::val::ValidationState_t> local_208;
  code *local_200;
  undefined8 local_1f8;
  type local_1f0;
  _Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(spvtools::val::ValidationState_t::*(std::reference_wrapper<spvtools::val::ValidationState_t>,_std::_Placeholder<1>))(unsigned_int)_const>
  local_1d8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1c0;
  undefined1 local_1b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  stringstream ss;
  ostream_type local_190 [376];
  ValidationState_t *local_18;
  ValidationState_t *__local;
  
  local_18 = _;
  sVar1 = ValidationState_t::unresolved_forward_id_count(_);
  if (sVar1 == 0) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)
               &ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ValidationState_t::UnresolvedForwardIds
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,local_18);
    local_1c0._M_current =
         (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8);
    local_1d8._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<spvtools::val::ValidationState_t>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::reference_wrapper<spvtools::val::ValidationState_t>,_false>.
    _M_head_impl._M_data =
         (_Tuple_impl<0UL,_std::reference_wrapper<spvtools::val::ValidationState_t>,_std::_Placeholder<1>_>
          )std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8);
    std::
    ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
    ::ostream_iterator((ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                        *)&local_1d8,local_190," ");
    local_200 = ValidationState_t::getIdName_abi_cxx11_;
    local_1f8 = 0;
    local_208 = std::ref<spvtools::val::ValidationState_t>(local_18);
    std::
    bind<std::__cxx11::string(spvtools::val::ValidationState_t::*)(unsigned_int)const,std::reference_wrapper<spvtools::val::ValidationState_t>,std::_Placeholder<1>const&>
              (&local_1f0,(offset_in_ValidationState_t_to_subr *)&local_200,&local_208,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::
    transform<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>,std::_Bind<std::__cxx11::string(spvtools::val::ValidationState_t::*(std::reference_wrapper<spvtools::val::ValidationState_t>,std::_Placeholder<1>))(unsigned_int)const>>
              ((uint *)((long)&id_str.field_2 + 8),local_1c0,
               (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                *)local_1d8._M_bound_args.
                  super__Tuple_impl<0UL,_std::reference_wrapper<spvtools::val::ValidationState_t>,_std::_Placeholder<1>_>
                  .
                  super__Head_base<0UL,_std::reference_wrapper<spvtools::val::ValidationState_t>,_false>
                  ._M_head_impl._M_data,&local_1d8);
    std::__cxx11::stringstream::str();
    ValidationState_t::diag(&local_410,local_18,SPV_ERROR_INVALID_ID,(Instruction *)0x0);
    pDVar2 = DiagnosticStream::operator<<
                       (&local_410,
                        (char (*) [61])
                        "The following forward referenced IDs have not been defined:\n");
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_430,(ulong)local_238);
    pDVar2 = DiagnosticStream::operator<<(pDVar2,&local_430);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    std::__cxx11::string::~string((string *)&local_430);
    DiagnosticStream::~DiagnosticStream(&local_410);
    std::__cxx11::string::~string(local_238);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8);
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)
               &ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateForwardDecls(ValidationState_t& _) {
  if (_.unresolved_forward_id_count() == 0) return SPV_SUCCESS;

  std::stringstream ss;
  std::vector<uint32_t> ids = _.UnresolvedForwardIds();

  std::transform(
      std::begin(ids), std::end(ids),
      std::ostream_iterator<std::string>(ss, " "),
      bind(&ValidationState_t::getIdName, std::ref(_), std::placeholders::_1));

  auto id_str = ss.str();
  return _.diag(SPV_ERROR_INVALID_ID, nullptr)
         << "The following forward referenced IDs have not been defined:\n"
         << id_str.substr(0, id_str.size() - 1);
}